

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O0

bool CheckStrifeItem(player_t *player,PClassActor *itemtype,int amount)

{
  AActor *this;
  AInventory *pAVar1;
  bool local_31;
  AInventory *item;
  int amount_local;
  PClassActor *itemtype_local;
  player_t *player_local;
  
  if ((itemtype == (PClassActor *)0x0) || (amount == 0)) {
    player_local._7_1_ = true;
  }
  else {
    this = TObjPtr<AActor>::operator->(&player->ConversationPC);
    pAVar1 = AActor::FindInventory(this,itemtype,false);
    if (pAVar1 == (AInventory *)0x0) {
      player_local._7_1_ = false;
    }
    else {
      local_31 = true;
      if (-1 < amount) {
        local_31 = amount <= pAVar1->Amount;
      }
      player_local._7_1_ = local_31;
    }
  }
  return player_local._7_1_;
}

Assistant:

static bool CheckStrifeItem (player_t *player, PClassActor *itemtype, int amount=-1)
{
	AInventory *item;

	if (itemtype == NULL || amount == 0)
		return true;

	item = player->ConversationPC->FindInventory (itemtype);
	if (item == NULL)
		return false;

	return amount < 0 || item->Amount >= amount;
}